

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_avx2.c
# Opt level: O3

void av1_get_horver_correlation_full_avx2
               (int16_t *diff,int stride,int width,int height,float *hcorr,float *vcorr)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  long lVar8;
  short *psVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int16_t *piVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  int16_t *piVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  int16_t *piVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  int16_t *piVar30;
  long lVar31;
  float fVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  float fVar57;
  undefined1 auVar58 [32];
  undefined1 auVar60 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar59 [64];
  undefined1 auVar61 [64];
  
  auVar40 = ZEXT1664((undefined1  [16])0x0);
  auVar47 = (undefined1  [16])0x0;
  lVar13 = (long)stride;
  auVar37 = ZEXT1664((undefined1  [16])0x0);
  if (3 < height) {
    piVar19 = diff + stride * 3;
    piVar30 = diff + stride * 2;
    piVar25 = diff + lVar13;
    uVar26 = 0;
    auVar48._8_2_ = 1;
    auVar48._0_8_ = 0x1000100010001;
    auVar48._10_2_ = 1;
    auVar48._12_2_ = 1;
    auVar48._14_2_ = 1;
    auVar48._16_2_ = 1;
    auVar48._18_2_ = 1;
    auVar48._20_2_ = 1;
    auVar48._22_2_ = 1;
    auVar48._24_2_ = 1;
    auVar48._26_2_ = 1;
    auVar48._28_2_ = 1;
    auVar48._30_2_ = 1;
    piVar15 = diff;
    do {
      auVar56 = ZEXT1664((undefined1  [16])0x0);
      auVar62 = auVar56._0_32_;
      auVar59 = ZEXT1664((undefined1  [16])0x0);
      auVar58 = auVar59._0_32_;
      auVar61 = ZEXT1664((undefined1  [16])0x0);
      auVar60 = auVar61._0_32_;
      auVar54 = ZEXT1664((undefined1  [16])0x0);
      auVar64 = auVar54._0_32_;
      if (3 < width) {
        lVar8 = 0;
        do {
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)(piVar15 + lVar8);
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *(ulong *)(piVar25 + lVar8);
          auVar47 = vpunpcklqdq_avx(auVar53,auVar47);
          auVar63._8_8_ = 0;
          auVar63._0_8_ = *(ulong *)(piVar30 + lVar8);
          auVar65._8_8_ = 0;
          auVar65._0_8_ = *(ulong *)(piVar19 + lVar8);
          auVar53 = vpunpcklqdq_avx(auVar65,auVar63);
          auVar62._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar53;
          auVar62._16_16_ = ZEXT116(1) * auVar47;
          auVar64 = vpsllq_avx2(auVar62,0x10);
          auVar62 = vpmaddwd_avx2(auVar64,auVar62);
          auVar62 = vpaddd_avx2(auVar62,auVar56._0_32_);
          auVar56 = ZEXT3264(auVar62);
          auVar58 = vpermq_avx2(auVar64,0x90);
          auVar58 = vpmaddwd_avx2(auVar64,auVar58);
          auVar58 = vpaddd_avx2(auVar58,auVar59._0_32_);
          auVar59 = ZEXT3264(auVar58);
          auVar60 = vpmaddwd_avx2(auVar64,auVar48);
          auVar60 = vpaddd_avx2(auVar60,auVar61._0_32_);
          auVar61 = ZEXT3264(auVar60);
          auVar64 = vpmaddwd_avx2(auVar64,auVar64);
          auVar64 = vpaddd_avx2(auVar64,auVar54._0_32_);
          auVar54 = ZEXT3264(auVar64);
          lVar8 = lVar8 + 3;
        } while (lVar8 <= width + -4);
      }
      auVar60 = vphaddd_avx2(auVar60,auVar64);
      auVar62 = vphaddd_avx2(auVar62,auVar58);
      auVar47 = vpshufd_avx(auVar62._16_16_,0xed);
      auVar53 = vpmovsxdq_avx(auVar47);
      auVar47 = vpshufd_avx(auVar62._16_16_,0xe8);
      auVar47 = vpmovsxdq_avx(auVar47);
      auVar47 = vpaddq_avx(auVar37._0_16_,auVar47);
      auVar63 = vpshufd_avx(auVar62._0_16_,0xed);
      auVar63 = vpmovsxdq_avx(auVar63);
      auVar53 = vpaddq_avx(auVar53,auVar63);
      auVar47 = vpaddq_avx(auVar47,auVar53);
      auVar37 = ZEXT1664(auVar47);
      auVar47 = vpshufd_avx(auVar60._16_16_,0xe7);
      auVar53 = vpmovsxdq_avx(auVar47);
      auVar47 = vpshufd_avx(auVar60._16_16_,0xe2);
      auVar47 = vpmovsxdq_avx(auVar47);
      auVar47 = vpaddq_avx(auVar40._0_16_,auVar47);
      auVar63 = vpshufd_avx(auVar60._0_16_,0xe7);
      auVar63 = vpmovsxdq_avx(auVar63);
      auVar53 = vpaddq_avx(auVar53,auVar63);
      auVar47 = vpaddq_avx(auVar47,auVar53);
      auVar40 = ZEXT1664(auVar47);
      uVar26 = uVar26 + 3;
      piVar19 = piVar19 + lVar13 * 3;
      piVar30 = piVar30 + lVar13 * 3;
      piVar25 = piVar25 + lVar13 * 3;
      piVar15 = piVar15 + lVar13 * 3;
    } while (uVar26 <= height - 4);
  }
  iVar16 = height % 3;
  lVar8 = auVar37._0_8_;
  if (iVar16 == 1) {
    lVar20 = (long)((height + -1) * stride);
    iVar7 = (int)diff[lVar20];
    uVar17 = (ulong)iVar7;
    uVar26 = CONCAT44(0,iVar7 * iVar7);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar17;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar26;
    auVar53 = vpunpcklqdq_avx(auVar50,auVar41);
    auVar47 = vpaddq_avx(auVar47,auVar53);
    lVar31 = vpextrq_avx(auVar37._0_16_,1);
    if (1 < width) {
      uVar21 = 0;
      do {
        sVar2 = diff[lVar20 + uVar21 + 1];
        uVar24 = (ulong)sVar2;
        lVar8 = lVar8 + (long)diff[lVar20 + uVar21] * uVar24;
        uVar17 = uVar17 + uVar24;
        uVar10 = CONCAT44(0,(int)sVar2 * (int)sVar2);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar24;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar10;
        auVar53 = vpunpcklqdq_avx(auVar42,auVar34);
        auVar47 = vpaddq_avx(auVar47,auVar53);
        uVar26 = uVar26 + uVar10;
        uVar21 = uVar21 + 1;
      } while (width - 1 != uVar21);
    }
  }
  else {
    lVar31 = (long)((height + -2) * stride);
    iVar7 = (int)diff[lVar31];
    lVar20 = (long)((height + -1) * stride);
    sVar2 = diff[lVar20];
    uVar17 = (ulong)sVar2;
    uVar23 = (int)sVar2 * (int)sVar2;
    uVar26 = (ulong)uVar23;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = (long)(sVar2 + iVar7);
    auVar53 = vpunpcklqdq_avx(ZEXT416(iVar7 * iVar7 + uVar23),auVar43);
    auVar47 = vpaddq_avx(auVar47,auVar53);
    if (width < 2) {
      lVar31 = vpextrq_avx(auVar37._0_16_,1);
    }
    else {
      uVar21 = 0;
      do {
        iVar7 = (int)diff[lVar31 + uVar21 + 1];
        iVar12 = (int)diff[lVar20 + uVar21];
        auVar53 = vpinsrw_avx(ZEXT416((uint)(int)diff[lVar20 + uVar21 + 1]),
                              (uint)(ushort)diff[lVar31 + uVar21],1);
        auVar63 = vpmovsxwd_avx(auVar53);
        auVar51._4_4_ = iVar12;
        auVar51._0_4_ = iVar12;
        auVar51._8_4_ = iVar12;
        auVar51._12_4_ = iVar12;
        auVar65 = vpmulld_avx(auVar51,auVar63);
        auVar53 = vpinsrq_avx(auVar37._0_16_,auVar37._0_8_ + (long)(auVar63._4_4_ * iVar7),0);
        auVar65 = vpmovsxdq_avx(auVar65);
        auVar53 = vpaddq_avx(auVar53,auVar65);
        auVar37 = ZEXT1664(auVar53);
        iVar12 = auVar63._0_4_;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = (long)(iVar12 + iVar7);
        auVar63 = vpunpcklqdq_avx(ZEXT416((uint)(iVar7 * iVar7 + iVar12 * iVar12)),auVar44);
        auVar47 = vpaddq_avx(auVar47,auVar63);
        uVar17 = uVar17 + (long)diff[lVar20 + uVar21 + 1];
        uVar26 = uVar26 + (uint)(iVar12 * iVar12);
        uVar21 = uVar21 + 1;
      } while (width - 1 != uVar21);
      lVar31 = vpextrq_avx(auVar53,1);
      lVar8 = auVar53._0_8_;
    }
  }
  if (width % 3 == 1) {
    iVar7 = (int)diff[(long)width + -1];
    uVar24 = (ulong)iVar7;
    uVar21 = CONCAT44(0,iVar7 * iVar7);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar24;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar21;
    auVar53 = vpunpcklqdq_avx(auVar45,auVar35);
    auVar47 = vpaddq_avx(auVar47,auVar53);
    if (1 < height) {
      psVar9 = diff + (long)width + -1;
      uVar10 = 0;
      do {
        sVar2 = *psVar9;
        sVar3 = psVar9[lVar13];
        uVar27 = (ulong)sVar3;
        psVar9 = psVar9 + lVar13;
        lVar31 = lVar31 + (long)sVar2 * uVar27;
        uVar24 = uVar24 + uVar27;
        uVar28 = CONCAT44(0,(int)sVar3 * (int)sVar3);
        uVar21 = uVar21 + uVar28;
        uVar1 = uVar10 + 1;
        bVar4 = (long)uVar10 < (long)(int)(((iVar16 == 1) - 3) + height);
        auVar52[1] = bVar4;
        auVar52[0] = bVar4;
        auVar52[2] = bVar4;
        auVar52[3] = bVar4;
        auVar52[4] = bVar4;
        auVar52[5] = bVar4;
        auVar52[6] = bVar4;
        auVar52[7] = bVar4;
        auVar52[8] = bVar4;
        auVar52[9] = bVar4;
        auVar52[10] = bVar4;
        auVar52[0xb] = bVar4;
        auVar52[0xc] = bVar4;
        auVar52[0xd] = bVar4;
        auVar52[0xe] = bVar4;
        auVar52[0xf] = bVar4;
        auVar53 = vpsllq_avx(auVar52,0x3f);
        auVar53 = vpcmpgtq_avx((undefined1  [16])0x0,auVar53);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar27;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = uVar28;
        auVar63 = vpunpcklqdq_avx(auVar55,auVar46);
        auVar53 = vpand_avx(auVar53,auVar63);
        auVar47 = vpaddq_avx(auVar53,auVar47);
        uVar10 = uVar1;
      } while (height - 1 != uVar1);
    }
  }
  else {
    iVar7 = (int)diff[(long)width + -2];
    sVar2 = diff[(long)width + -1];
    uVar24 = (ulong)sVar2;
    uVar23 = (int)sVar2 * (int)sVar2;
    uVar21 = (ulong)uVar23;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = (long)(sVar2 + iVar7);
    auVar53 = vpunpcklqdq_avx(ZEXT416(iVar7 * iVar7 + uVar23),auVar36);
    auVar47 = vpaddq_avx(auVar47,auVar53);
    auVar37 = ZEXT1664(auVar47);
    if (1 < height) {
      psVar9 = diff + (long)width + -1;
      uVar10 = 0;
      do {
        iVar7 = (int)psVar9[lVar13 + -1];
        if (iVar16 == 1 || uVar10 < height - 2) {
          lVar8 = lVar8 + (int)psVar9[-1] * (int)*psVar9;
          lVar31 = lVar31 + psVar9[-1] * iVar7;
        }
        sVar2 = psVar9[lVar13];
        uVar23 = (int)sVar2 * (int)sVar2;
        if ((long)uVar10 < (long)(int)(((iVar16 == 1) - 3) + height)) {
          auVar39._8_8_ = 0;
          auVar39._0_8_ = (long)(iVar7 + sVar2);
          auVar47 = vpunpcklqdq_avx(ZEXT416(iVar7 * iVar7 + uVar23),auVar39);
          auVar47 = vpaddq_avx(auVar37._0_16_,auVar47);
          auVar37 = ZEXT1664(auVar47);
        }
        auVar47 = auVar37._0_16_;
        uVar10 = uVar10 + 1;
        uVar24 = uVar24 + (long)sVar2;
        uVar21 = uVar21 + uVar23;
        lVar31 = lVar31 + (int)*psVar9 * (int)sVar2;
        psVar9 = psVar9 + lVar13;
      } while (height - 1 != uVar10);
    }
  }
  if (width < 1) {
    lVar29 = 0;
    lVar20 = 0;
  }
  else {
    uVar10 = 0;
    lVar20 = 0;
    lVar29 = 0;
    do {
      iVar16 = (int)diff[uVar10];
      lVar20 = lVar20 + iVar16;
      lVar29 = lVar29 + (ulong)(uint)(iVar16 * iVar16);
      uVar10 = uVar10 + 1;
    } while ((uint)width != uVar10);
  }
  if (height < 1) {
    lVar11 = 0;
    lVar22 = 0;
  }
  else {
    uVar10 = (ulong)(uint)height;
    lVar22 = 0;
    lVar11 = 0;
    do {
      iVar16 = (int)*diff;
      lVar11 = lVar11 + iVar16;
      lVar22 = lVar22 + (ulong)(uint)(iVar16 * iVar16);
      diff = diff + lVar13;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  lVar14 = vpextrq_avx(auVar47,1);
  lVar13 = lVar14 - uVar24;
  fVar38 = (float)((width + -1) * height);
  lVar18 = lVar14 - uVar17;
  lVar33 = auVar47._0_8_;
  fVar57 = (float)((height + -1) * width);
  fVar32 = (float)(long)(lVar33 - uVar21) - (float)(lVar13 * lVar13) / fVar38;
  fVar5 = (float)(long)(lVar33 - uVar26) - (float)(lVar18 * lVar18) / fVar57;
  fVar49 = 1.0;
  if (0.0 < fVar32) {
    lVar11 = lVar14 - lVar11;
    fVar6 = (float)(lVar33 - lVar22) - (float)(lVar11 * lVar11) / fVar38;
    fVar49 = 1.0;
    if (0.0 < fVar6) {
      fVar32 = fVar32 * fVar6;
      auVar47 = ZEXT816(0);
      if (fVar32 < 0.0) {
        fVar32 = sqrtf(fVar32);
        auVar47 = ZEXT816(0) << 0x40;
      }
      else {
        auVar53 = vsqrtss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32));
        fVar32 = auVar53._0_4_;
      }
      auVar47 = vmaxss_avx(auVar47,ZEXT416((uint)(((float)lVar8 - (float)(lVar11 * lVar13) / fVar38)
                                                 / fVar32)));
      fVar49 = auVar47._0_4_;
    }
  }
  fVar32 = 1.0;
  *hcorr = fVar49;
  if (0.0 < fVar5) {
    lVar14 = lVar14 - lVar20;
    fVar38 = (float)(lVar33 - lVar29) - (float)(lVar14 * lVar14) / fVar57;
    if (0.0 < fVar38) {
      fVar5 = fVar5 * fVar38;
      if (fVar5 < 0.0) {
        fVar32 = sqrtf(fVar5);
      }
      else {
        auVar47 = vsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
        fVar32 = auVar47._0_4_;
      }
      auVar47 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(((float)lVar31 - (float)(lVar14 * lVar18) / fVar57) /
                                         fVar32)));
      fVar32 = auVar47._0_4_;
    }
  }
  *vcorr = fVar32;
  return;
}

Assistant:

void av1_get_horver_correlation_full_avx2(const int16_t *diff, int stride,
                                          int width, int height, float *hcorr,
                                          float *vcorr) {
  // The following notation is used:
  // x - current pixel
  // y - right neighbour pixel
  // z - below neighbour pixel
  // w - down-right neighbour pixel
  int64_t xy_sum = 0, xz_sum = 0;
  int64_t x_sum = 0, x2_sum = 0;

  // Process horizontal and vertical correlations through the body in 4x4
  // blocks.  This excludes the final row and column and possibly one extra
  // column depending how 3 divides into width and height
  int32_t xy_xz_tmp[8] = { 0 }, x_x2_tmp[8] = { 0 };
  __m256i xy_sum_32 = _mm256_setzero_si256();
  __m256i xz_sum_32 = _mm256_setzero_si256();
  __m256i x_sum_32 = _mm256_setzero_si256();
  __m256i x2_sum_32 = _mm256_setzero_si256();
  for (int i = 0; i <= height - 4; i += 3) {
    for (int j = 0; j <= width - 4; j += 3) {
      horver_correlation_4x4(&diff[i * stride + j], stride, &xy_sum_32,
                             &xz_sum_32, &x_sum_32, &x2_sum_32);
    }
    const __m256i hadd_xy_xz = _mm256_hadd_epi32(xy_sum_32, xz_sum_32);
    // hadd_xy_xz = [ae+bf+cg ei+fj+gk ab+bc+cd ef+fg+gh]
    //              [im+jn+ko mm+nn+oo ij+jk+kl mn+no+op] as i32
    yy_storeu_256(xy_xz_tmp, hadd_xy_xz);
    xy_sum += (int64_t)xy_xz_tmp[5] + xy_xz_tmp[4] + xy_xz_tmp[1];
    xz_sum += (int64_t)xy_xz_tmp[7] + xy_xz_tmp[6] + xy_xz_tmp[3];

    const __m256i hadd_x_x2 = _mm256_hadd_epi32(x_sum_32, x2_sum_32);
    // hadd_x_x2 = [aa+bb+cc ee+ff+gg a+b+c e+f+g]
    //             [ii+jj+kk mm+nn+oo i+j+k m+n+o] as i32
    yy_storeu_256(x_x2_tmp, hadd_x_x2);
    x_sum += (int64_t)x_x2_tmp[5] + x_x2_tmp[4] + x_x2_tmp[1];
    x2_sum += (int64_t)x_x2_tmp[7] + x_x2_tmp[6] + x_x2_tmp[3];

    xy_sum_32 = _mm256_setzero_si256();
    xz_sum_32 = _mm256_setzero_si256();
    x_sum_32 = _mm256_setzero_si256();
    x2_sum_32 = _mm256_setzero_si256();
  }

  // x_sum now covers every pixel except the final 1-2 rows and 1-2 cols
  int64_t x_finalrow = 0, x_finalcol = 0, x2_finalrow = 0, x2_finalcol = 0;

  // Do we have 2 rows remaining or just the one?  Note that width and height
  // are powers of 2, so each modulo 3 must be 1 or 2.
  if (height % 3 == 1) {  // Just horiz corrs on the final row
    const int16_t x0 = diff[(height - 1) * stride];
    x_sum += x0;
    x_finalrow += x0;
    x2_sum += x0 * x0;
    x2_finalrow += x0 * x0;
    for (int j = 0; j < width - 1; ++j) {
      const int16_t x = diff[(height - 1) * stride + j];
      const int16_t y = diff[(height - 1) * stride + j + 1];
      xy_sum += x * y;
      x_sum += y;
      x2_sum += y * y;
      x_finalrow += y;
      x2_finalrow += y * y;
    }
  } else {  // Two rows remaining to do
    const int16_t x0 = diff[(height - 2) * stride];
    const int16_t z0 = diff[(height - 1) * stride];
    x_sum += x0 + z0;
    x2_sum += x0 * x0 + z0 * z0;
    x_finalrow += z0;
    x2_finalrow += z0 * z0;
    for (int j = 0; j < width - 1; ++j) {
      const int16_t x = diff[(height - 2) * stride + j];
      const int16_t y = diff[(height - 2) * stride + j + 1];
      const int16_t z = diff[(height - 1) * stride + j];
      const int16_t w = diff[(height - 1) * stride + j + 1];

      // Horizontal and vertical correlations for the penultimate row:
      xy_sum += x * y;
      xz_sum += x * z;

      // Now just horizontal correlations for the final row:
      xy_sum += z * w;

      x_sum += y + w;
      x2_sum += y * y + w * w;
      x_finalrow += w;
      x2_finalrow += w * w;
    }
  }

  // Do we have 2 columns remaining or just the one?
  if (width % 3 == 1) {  // Just vert corrs on the final col
    const int16_t x0 = diff[width - 1];
    x_sum += x0;
    x_finalcol += x0;
    x2_sum += x0 * x0;
    x2_finalcol += x0 * x0;
    for (int i = 0; i < height - 1; ++i) {
      const int16_t x = diff[i * stride + width - 1];
      const int16_t z = diff[(i + 1) * stride + width - 1];
      xz_sum += x * z;
      x_finalcol += z;
      x2_finalcol += z * z;
      // So the bottom-right elements don't get counted twice:
      if (i < height - (height % 3 == 1 ? 2 : 3)) {
        x_sum += z;
        x2_sum += z * z;
      }
    }
  } else {  // Two cols remaining
    const int16_t x0 = diff[width - 2];
    const int16_t y0 = diff[width - 1];
    x_sum += x0 + y0;
    x2_sum += x0 * x0 + y0 * y0;
    x_finalcol += y0;
    x2_finalcol += y0 * y0;
    for (int i = 0; i < height - 1; ++i) {
      const int16_t x = diff[i * stride + width - 2];
      const int16_t y = diff[i * stride + width - 1];
      const int16_t z = diff[(i + 1) * stride + width - 2];
      const int16_t w = diff[(i + 1) * stride + width - 1];

      // Horizontal and vertical correlations for the penultimate col:
      // Skip these on the last iteration of this loop if we also had two
      // rows remaining, otherwise the final horizontal and vertical correlation
      // get erroneously processed twice
      if (i < height - 2 || height % 3 == 1) {
        xy_sum += x * y;
        xz_sum += x * z;
      }

      x_finalcol += w;
      x2_finalcol += w * w;
      // So the bottom-right elements don't get counted twice:
      if (i < height - (height % 3 == 1 ? 2 : 3)) {
        x_sum += z + w;
        x2_sum += z * z + w * w;
      }

      // Now just vertical correlations for the final column:
      xz_sum += y * w;
    }
  }

  // Calculate the simple sums and squared-sums
  int64_t x_firstrow = 0, x_firstcol = 0;
  int64_t x2_firstrow = 0, x2_firstcol = 0;

  for (int j = 0; j < width; ++j) {
    x_firstrow += diff[j];
    x2_firstrow += diff[j] * diff[j];
  }
  for (int i = 0; i < height; ++i) {
    x_firstcol += diff[i * stride];
    x2_firstcol += diff[i * stride] * diff[i * stride];
  }

  int64_t xhor_sum = x_sum - x_finalcol;
  int64_t xver_sum = x_sum - x_finalrow;
  int64_t y_sum = x_sum - x_firstcol;
  int64_t z_sum = x_sum - x_firstrow;
  int64_t x2hor_sum = x2_sum - x2_finalcol;
  int64_t x2ver_sum = x2_sum - x2_finalrow;
  int64_t y2_sum = x2_sum - x2_firstcol;
  int64_t z2_sum = x2_sum - x2_firstrow;

  const float num_hor = (float)(height * (width - 1));
  const float num_ver = (float)((height - 1) * width);

  const float xhor_var_n = x2hor_sum - (xhor_sum * xhor_sum) / num_hor;
  const float xver_var_n = x2ver_sum - (xver_sum * xver_sum) / num_ver;

  const float y_var_n = y2_sum - (y_sum * y_sum) / num_hor;
  const float z_var_n = z2_sum - (z_sum * z_sum) / num_ver;

  const float xy_var_n = xy_sum - (xhor_sum * y_sum) / num_hor;
  const float xz_var_n = xz_sum - (xver_sum * z_sum) / num_ver;

  if (xhor_var_n > 0 && y_var_n > 0) {
    *hcorr = xy_var_n / sqrtf(xhor_var_n * y_var_n);
    *hcorr = *hcorr < 0 ? 0 : *hcorr;
  } else {
    *hcorr = 1.0;
  }
  if (xver_var_n > 0 && z_var_n > 0) {
    *vcorr = xz_var_n / sqrtf(xver_var_n * z_var_n);
    *vcorr = *vcorr < 0 ? 0 : *vcorr;
  } else {
    *vcorr = 1.0;
  }
}